

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O1

void __thiscall PEFile::PEFile(PEFile *this,AbstractByteBuffer *v_buf)

{
  _Rb_tree_header *p_Var1;
  
  Executable::Executable((Executable *)this,v_buf,BITS_32);
  p_Var1 = &(this->super_MappedExe).super_ExeWrappersContainer.wrappers._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_MappedExe).super_ExeWrappersContainer.wrappers._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_MappedExe).super_ExeWrappersContainer.wrappers._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_MappedExe).super_ExeWrappersContainer.wrappers._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_MappedExe).super_ExeWrappersContainer.wrappers._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_MappedExe).super_ExeWrappersContainer.wrappers._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__PEFile_00154fe0;
  (this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer =
       (_func_int **)&PTR__PEFile_00155100;
  (this->core)._vptr_PECore = (_func_int **)&PTR__PECore_00159d30;
  memset(&(this->core).buf,0,0xd0);
  ExeWrappersContainer::clearWrappers(&(this->super_MappedExe).super_ExeWrappersContainer);
  this->optHdr = (OptHdrWrapper *)0x0;
  this->sects = (SectHdrsWrapper *)0x0;
  this->dosHdrWrapper = (DosHdrWrapper *)0x0;
  this->fHdr = (FileHdrWrapper *)0x0;
  _init(this,v_buf);
  Logger::append(D_INFO,"Wrapped");
  return;
}

Assistant:

PEFile::PEFile(AbstractByteBuffer *v_buf)
    : MappedExe(v_buf, Executable::BITS_32), 
    dosHdrWrapper(NULL), fHdr(NULL), optHdr(NULL), sects(NULL),
    album(NULL)
{
    clearWrappers();

    _init(v_buf);
    Logger::append(Logger::D_INFO,"Wrapped");
}